

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::XThreadEvent::ensureDoneOrCanceled(XThreadEvent *this)

{
  bool bVar1;
  Executor *pEVar2;
  Impl *pIVar3;
  State *pSVar4;
  Own<kj::Executor,_std::nullptr_t> *this_00;
  RefOrVoid<kj::Executor> other;
  Type *func;
  Type *func_00;
  long *in_FS_OFFSET;
  undefined1 local_1e0 [8];
  Locked<kj::Executor::Impl::State> lock_1;
  Executor *e_1;
  Executor *_e1034;
  Fault f_1;
  Fault f;
  undefined1 local_1a8 [5];
  DebugExpression<bool> _kjCondition;
  XThreadEvent *local_198 [2];
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_188;
  Maybe<kj::_::XThreadEvent_&> local_178 [2];
  undefined1 local_168 [24];
  undefined1 local_150 [8];
  Locked<kj::Executor::Impl::State> selfLock;
  undefined1 local_130 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:981:15)>
  _kjDefer981;
  Vector<kj::_::XThreadEvent_*> eventsToCancelOutsideLock;
  Maybe<kj::_::XThreadEvent_&> *pMStack_e0;
  bool otherThreadIsWaiting;
  Executor *local_d8;
  undefined1 local_d0 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:959:11)>
  _kjDefer971;
  Executor *selfExecutor;
  Executor *_selfExecutor944;
  Own<kj::Executor,_std::nullptr_t> *e;
  Own<kj::Executor,_std::nullptr_t> *_e939;
  Maybe<kj::Executor_&> local_90;
  Maybe<kj::Executor_&> maybeSelfExecutor;
  EventPort *p;
  EventPort *_p933;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_70;
  XThreadEvent *local_60;
  EventLoop *local_58;
  EventLoop *l;
  EventLoop *local_40;
  EventLoop *_l911;
  EventLoop *loop;
  undefined1 local_28 [8];
  Locked<kj::Executor::Impl::State> lock;
  XThreadEvent *this_local;
  
  lock.ptr._4_4_ = this->state;
  if (lock.ptr._4_4_ != DONE) {
    pEVar2 = Own<const_kj::Executor,_std::nullptr_t>::operator->(&this->targetExecutor);
    pIVar3 = Own<kj::Executor::Impl,_std::nullptr_t>::operator->(&pEVar2->impl);
    MutexGuarded<kj::Executor::Impl::State>::lockExclusive
              ((MutexGuarded<kj::Executor::Impl::State> *)local_28,pIVar3);
    pSVar4 = Locked<kj::Executor::Impl::State>::operator->
                       ((Locked<kj::Executor::Impl::State> *)local_28);
    local_40 = readMaybe<kj::EventLoop>(&pSVar4->loop);
    if (local_40 == (EventLoop *)0x0) {
      local_60 = this;
      Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_70);
      Locked<kj::Executor::Impl::State>::wait<kj::_::XThreadEvent::ensureDoneOrCanceled()::__0>
                ((Locked<kj::Executor::Impl::State> *)local_28,&local_60,&local_70);
      Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_70);
      bVar1 = true;
    }
    else {
      local_58 = local_40;
      _l911 = local_40;
      switch(this->state) {
      case UNUSED:
        break;
      case QUEUED:
        pSVar4 = Locked<kj::Executor::Impl::State>::operator->
                           ((Locked<kj::Executor::Impl::State> *)local_28);
        List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
                  (&pSVar4->start,(char *)this);
        this->state = DONE;
        break;
      case EXECUTING:
        pSVar4 = Locked<kj::Executor::Impl::State>::operator->
                           ((Locked<kj::Executor::Impl::State> *)local_28);
        List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
                  (&pSVar4->executing,(char *)this);
        pSVar4 = Locked<kj::Executor::Impl::State>::operator->
                           ((Locked<kj::Executor::Impl::State> *)local_28);
        List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::add(&pSVar4->cancel,this);
        this->state = CANCELING;
        pEVar2 = (Executor *)readMaybe<kj::EventPort>(&_l911->port);
        if (pEVar2 != (Executor *)0x0) {
          maybeSelfExecutor.ptr = pEVar2;
          (*pEVar2->_vptr_Executor[3])();
        }
        Maybe<kj::Executor_&>::Maybe(&local_90);
        if ((*(long *)(*in_FS_OFFSET + -0x20) != 0) &&
           (this_00 = readMaybe<kj::Executor,decltype(nullptr)>
                                ((Maybe<kj::Own<kj::Executor,_std::nullptr_t>_> *)
                                 (in_FS_OFFSET[-4] + 0x40)),
           this_00 != (Own<kj::Executor,_std::nullptr_t> *)0x0)) {
          other = Own<kj::Executor,_std::nullptr_t>::operator*(this_00);
          Maybe<kj::Executor_&>::operator=(&local_90,other);
        }
        pEVar2 = readMaybe<kj::Executor>(&local_90);
        if (pEVar2 == (Executor *)0x0) {
          local_198[0] = this;
          Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe
                    ((Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> *)local_1a8);
          Locked<kj::Executor::Impl::State>::wait<kj::_::XThreadEvent::ensureDoneOrCanceled()::__4>
                    ((Locked<kj::Executor::Impl::State> *)local_28,local_198,local_1a8);
          Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe
                    ((Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> *)local_1a8);
        }
        else {
          pMStack_e0 = (Maybe<kj::_::XThreadEvent_&> *)local_28;
          local_d8 = pEVar2;
          _kjDefer971.maybeFunc.ptr.field_1.value.selfExecutor = pEVar2;
          defer<kj::_::XThreadEvent::ensureDoneOrCanceled()::__1>
                    ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:959:11)>
                      *)local_d0,(kj *)&stack0xffffffffffffff20,func);
          while (this->state != DONE) {
            pSVar4 = Locked<kj::Executor::Impl::State>::operator->
                               ((Locked<kj::Executor::Impl::State> *)local_28);
            bVar1 = pSVar4->waitingForCancel;
            Locked<kj::Executor::Impl::State>::Locked
                      ((Locked<kj::Executor::Impl::State> *)
                       &eventsToCancelOutsideLock.builder.disposer);
            Locked<kj::Executor::Impl::State>::operator=
                      ((Locked<kj::Executor::Impl::State> *)local_28,
                       (Locked<kj::Executor::Impl::State> *)
                       &eventsToCancelOutsideLock.builder.disposer);
            Locked<kj::Executor::Impl::State>::~Locked
                      ((Locked<kj::Executor::Impl::State> *)
                       &eventsToCancelOutsideLock.builder.disposer);
            Vector<kj::_::XThreadEvent_*>::Vector
                      ((Vector<kj::_::XThreadEvent_*> *)
                       ((long)&_kjDefer981.maybeFunc.ptr.field_1 + 8));
            selfLock.ptr = (State *)_kjDefer971.maybeFunc.ptr.field_1.value.selfExecutor;
            defer<kj::_::XThreadEvent::ensureDoneOrCanceled()::__2>
                      ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:981:15)>
                        *)local_130,(kj *)&selfLock.ptr,func_00);
            pIVar3 = Own<kj::Executor::Impl,_std::nullptr_t>::operator->
                               (&(_kjDefer971.maybeFunc.ptr.field_1.value.selfExecutor)->impl);
            MutexGuarded<kj::Executor::Impl::State>::lockExclusive
                      ((MutexGuarded<kj::Executor::Impl::State> *)local_150,pIVar3);
            pSVar4 = Locked<kj::Executor::Impl::State>::operator->
                               ((Locked<kj::Executor::Impl::State> *)local_150);
            pSVar4->waitingForCancel = true;
            pSVar4 = Locked<kj::Executor::Impl::State>::operator->
                               ((Locked<kj::Executor::Impl::State> *)local_150);
            Executor::Impl::State::dispatchCancels
                      (pSVar4,(Vector<kj::_::XThreadEvent_*> *)
                              ((long)&_kjDefer981.maybeFunc.ptr.field_1 + 8));
            Locked<kj::Executor::Impl::State>::~Locked
                      ((Locked<kj::Executor::Impl::State> *)local_150);
            Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:981:15)>
            ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:981:15)>
                         *)local_130);
            Vector<kj::_::XThreadEvent_*>::~Vector
                      ((Vector<kj::_::XThreadEvent_*> *)
                       ((long)&_kjDefer981.maybeFunc.ptr.field_1 + 8));
            if ((bVar1 & 1U) != 0) {
              sched_yield();
            }
            pEVar2 = Own<const_kj::Executor,_std::nullptr_t>::operator->(&this->targetExecutor);
            pIVar3 = Own<kj::Executor::Impl,_std::nullptr_t>::operator->(&pEVar2->impl);
            MutexGuarded<kj::Executor::Impl::State>::lockExclusive
                      ((MutexGuarded<kj::Executor::Impl::State> *)local_168,pIVar3);
            Locked<kj::Executor::Impl::State>::operator=
                      ((Locked<kj::Executor::Impl::State> *)local_28,
                       (Locked<kj::Executor::Impl::State> *)local_168);
            Locked<kj::Executor::Impl::State>::~Locked
                      ((Locked<kj::Executor::Impl::State> *)local_168);
            local_178[0].ptr = this;
            Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe(&local_188);
            Locked<kj::Executor::Impl::State>::
            wait<kj::_::XThreadEvent::ensureDoneOrCanceled()::__3>
                      ((Locked<kj::Executor::Impl::State> *)local_28,local_178,&local_188);
            Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_188);
          }
          Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:959:11)>
          ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:959:11)>
                       *)local_d0);
        }
        bVar1 = ListLink<kj::_::XThreadEvent>::isLinked(&this->targetLink);
        f.exception._4_1_ = ~bVar1 & 1;
        f.exception._5_1_ =
             DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f.exception + 4));
        bVar1 = _::DebugExpression::operator_cast_to_bool
                          ((DebugExpression *)((long)&f.exception + 5));
        if (!bVar1) {
          Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                    (&f_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                     ,0x3ff,FAILED,"!targetLink.isLinked()","_kjCondition,",
                     (DebugExpression<bool> *)((long)&f.exception + 5));
          Debug::Fault::fatal(&f_1);
        }
        break;
      case CANCELING:
        Debug::Fault::Fault<kj::Exception::Type,char_const(&)[69]>
                  ((Fault *)&_e1034,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                   ,0x403,FAILED,(char *)0x0,
                   "\"impossible state: CANCELING should only be set within the above case\"",
                   (char (*) [69])
                   "impossible state: CANCELING should only be set within the above case");
        Debug::Fault::fatal((Fault *)&_e1034);
      case DONE:
      }
      bVar1 = false;
    }
    Locked<kj::Executor::Impl::State>::~Locked((Locked<kj::Executor::Impl::State> *)local_28);
    if (bVar1) {
      return;
    }
  }
  lock_1.ptr = (State *)readMaybe<kj::Executor_const>(&this->replyExecutor);
  if ((lock_1.ptr != (State *)0x0) &&
     (bVar1 = ListLink<kj::_::XThreadEvent>::isLinked(&this->replyLink), bVar1)) {
    pIVar3 = Own<kj::Executor::Impl,_std::nullptr_t>::operator->
                       ((Own<kj::Executor::Impl,_std::nullptr_t> *)&(lock_1.ptr)->start);
    MutexGuarded<kj::Executor::Impl::State>::lockExclusive
              ((MutexGuarded<kj::Executor::Impl::State> *)local_1e0,pIVar3);
    pSVar4 = Locked<kj::Executor::Impl::State>::operator->
                       ((Locked<kj::Executor::Impl::State> *)local_1e0);
    List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::replyLink>::remove
              (&pSVar4->replies,(char *)this);
    Locked<kj::Executor::Impl::State>::~Locked((Locked<kj::Executor::Impl::State> *)local_1e0);
  }
  return;
}

Assistant:

void XThreadEvent::ensureDoneOrCanceled() {
  if (__atomic_load_n(&state, __ATOMIC_ACQUIRE) != DONE) {
    auto lock = targetExecutor->impl->state.lockExclusive();

    const EventLoop* loop;
    KJ_IF_SOME(l, lock->loop) {
      loop = &l;
    } else {
      // Target event loop is already dead, so we know it's already working on transitioning all
      // events to the DONE state. We can just wait.
      lock.wait([&](auto&) { return state == DONE; });
      return;
    }

    switch (state) {
      case UNUSED:
        // Nothing to do.
        break;
      case QUEUED:
        lock->start.remove(*this);
        // No wake needed since we removed work rather than adding it.
        state = DONE;
        break;
      case EXECUTING: {
        lock->executing.remove(*this);
        lock->cancel.add(*this);
        state = CANCELING;
        KJ_IF_SOME(p, loop->port) {
          p.wake();
        }

        Maybe<Executor&> maybeSelfExecutor = kj::none;
        if (threadLocalEventLoop != nullptr) {
          KJ_IF_SOME(e, threadLocalEventLoop->executor) {
            maybeSelfExecutor = *e;
          }
        }

        KJ_IF_SOME(selfExecutor, maybeSelfExecutor) {
          // If, while waiting for other threads to process our cancellation request, we have
          // cancellation requests queued back to this thread, we must process them. Otherwise,
          // we could deadlock with two threads waiting on each other to process cancellations.
          //
          // We don't have a terribly good way to detect this, except to check if the remote
          // thread is itself waiting for cancellations and, if so, wake ourselves up to check for
          // cancellations to process. This will busy-loop but at least it should eventually
          // resolve assuming fair scheduling.
          //
          // To make things extra-annoying, in order to update our waitingForCancel flag, we have
          // to lock our own executor state, but we can't take both locks at once, so we have to
          // release the other lock in the meantime.

          // Make sure we unset waitingForCancel on the way out.
          KJ_DEFER({
            lock = {};

            Vector<_::XThreadEvent*> eventsToCancelOutsideLock;
            KJ_DEFER(selfExecutor.impl->processAsyncCancellations(eventsToCancelOutsideLock));

            auto selfLock = selfExecutor.impl->state.lockExclusive();
            selfLock->waitingForCancel = false;
            selfLock->dispatchCancels(eventsToCancelOutsideLock);

            // We don't need to re-take the lock on the other executor here; it's not used again
            // after this scope.
          });

          while (state != DONE) {
            bool otherThreadIsWaiting = lock->waitingForCancel;

            // Make sure our waitingForCancel is on and dispatch any pending cancellations on this
            // thread.
            lock = {};
            {
              Vector<_::XThreadEvent*> eventsToCancelOutsideLock;
              KJ_DEFER(selfExecutor.impl->processAsyncCancellations(eventsToCancelOutsideLock));

              auto selfLock = selfExecutor.impl->state.lockExclusive();
              selfLock->waitingForCancel = true;

              // Note that we don't have to proactively delete the PromiseNodes extracted from
              // the canceled events because those nodes belong to this thread and can't possibly
              // continue executing while we're blocked here.
              selfLock->dispatchCancels(eventsToCancelOutsideLock);
            }

            if (otherThreadIsWaiting) {
              // We know the other thread was waiting for cancellations to complete a moment ago.
              // We may have just processed the necessary cancellations in this thread, in which
              // case the other thread needs a chance to receive control and notice this. Or, it
              // may be that the other thread is waiting for some third thread to take action.
              // Either way, we should yield control here to give things a chance to settle.
              // Otherwise we could end up in a tight busy loop.
#if _WIN32
              Sleep(0);
#else
              sched_yield();
#endif
            }

            // OK now we can take the original lock again.
            lock = targetExecutor->impl->state.lockExclusive();

            // OK, now we can wait for the other thread to either process our cancellation or
            // indicate that it is waiting for remote cancellation.
            lock.wait([&](const Executor::Impl::State& executorState) {
              return state == DONE || executorState.waitingForCancel;
            });
          }
        } else {
          // We have no executor of our own so we don't have to worry about cancellation cycles
          // causing deadlock.
          //
          // NOTE: I don't think we can actually get here, because it implies that this is a
          //   synchronous execution, which means there's no way to cancel it.
          lock.wait([&](auto&) { return state == DONE; });
        }
        KJ_DASSERT(!targetLink.isLinked());
        break;
      }
      case CANCELING:
        KJ_FAIL_ASSERT("impossible state: CANCELING should only be set within the above case");
      case DONE:
        // Became done while we waited for lock. Nothing to do.
        break;
    }